

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

MockSpec<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
* __thiscall
testing::internal::
FunctionMocker<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
::With(MockSpec<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
       *__return_storage_ptr__,
      FunctionMocker<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
      *this,Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&> *m,
      Matcher<int> *m_1,Matcher<unsigned_int> *m_2)

{
  _Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
  local_58;
  
  local_58.super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>.
  super__Tuple_impl<2UL,_testing::Matcher<unsigned_int>_>.
  super__Head_base<2UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
  super_MatcherBase<unsigned_int>.vtable_ = (m_2->super_MatcherBase<unsigned_int>).vtable_;
  local_58.super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>.
  super__Tuple_impl<2UL,_testing::Matcher<unsigned_int>_>.
  super__Head_base<2UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
  super_MatcherBase<unsigned_int>.buffer_ = (m_2->super_MatcherBase<unsigned_int>).buffer_;
  (m_2->super_MatcherBase<unsigned_int>).vtable_ = (VTable *)0x0;
  local_58.super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>.
  super__Tuple_impl<2UL,_testing::Matcher<unsigned_int>_>.
  super__Head_base<2UL,_testing::Matcher<unsigned_int>,_false>._M_head_impl.
  super_MatcherBase<unsigned_int>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00318740;
  local_58.super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.vtable_ =
       (m_1->super_MatcherBase<int>).vtable_;
  local_58.super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.buffer_ =
       (m_1->super_MatcherBase<int>).buffer_;
  (m_1->super_MatcherBase<int>).vtable_ = (VTable *)0x0;
  local_58.super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00324550;
  local_58.
  super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_false>
  ._M_head_impl.
  super_MatcherBase<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>.
  vtable_ = (m->
            super_MatcherBase<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>
            ).vtable_;
  local_58.
  super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_false>
  ._M_head_impl.
  super_MatcherBase<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>.
  buffer_ = (m->
            super_MatcherBase<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>
            ).buffer_;
  (m->super_MatcherBase<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>).
  vtable_ = (VTable *)0x0;
  local_58.
  super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_false>
  ._M_head_impl.
  super_MatcherBase<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_003246f0;
  __return_storage_ptr__->function_mocker_ = this;
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
  ::_Tuple_impl(&(__return_storage_ptr__->matchers_).
                 super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
                ,&local_58);
  MatcherBase<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>::
  ~MatcherBase((MatcherBase<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>
                *)&local_58.
                   super__Head_base<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_false>
              );
  MatcherBase<int>::~MatcherBase
            ((MatcherBase<int> *)
             &local_58.
              super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>.
              super__Head_base<1UL,_testing::Matcher<int>,_false>);
  MatcherBase<unsigned_int>::~MatcherBase((MatcherBase<unsigned_int> *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }